

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * lj_meta_tget(lua_State *L,cTValue *o,cTValue *k)

{
  cTValue *pcVar1;
  TValue *pTVar2;
  cTValue *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  cTValue *tv;
  GCtab *t;
  cTValue *mo;
  int loop;
  undefined4 in_stack_ffffffffffffffa8;
  ErrMsg in_stack_ffffffffffffffac;
  cTValue *in_stack_ffffffffffffffb0;
  cTValue *in_stack_ffffffffffffffb8;
  ulong in_stack_ffffffffffffffc8;
  cTValue *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  
  iVar3 = 0;
  do {
    if (99 < iVar3) {
      lj_err_msg((lua_State *)&in_stack_ffffffffffffffb0->field_2,in_stack_ffffffffffffffac);
    }
    if ((in_RSI->field_2).it == 0xfffffff4) {
      in_stack_ffffffffffffffc8 = (ulong)(in_RSI->u32).lo;
      pcVar1 = lj_tab_get((lua_State *)&in_RSI->field_2,(GCtab *)&in_RDX->field_2,
                          (cTValue *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
      if ((pcVar1->field_2).it != 0xffffffff) {
        return pcVar1;
      }
      if (*(int *)(in_stack_ffffffffffffffc8 + 0x10) == 0) {
        in_stack_ffffffffffffffb8 = (cTValue *)0x0;
      }
      else if ((*(byte *)((ulong)*(uint *)(in_stack_ffffffffffffffc8 + 0x10) + 6) & 1) == 0) {
        in_stack_ffffffffffffffb0 =
             lj_meta_cache((GCtab *)&in_stack_ffffffffffffffb8->field_2,
                           (MMS)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                           (GCstr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0;
      }
      else {
        in_stack_ffffffffffffffb0 = (cTValue *)0x0;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0;
      }
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffb8;
      if (in_stack_ffffffffffffffb8 == (cTValue *)0x0) {
        return pcVar1;
      }
    }
    else {
      in_stack_ffffffffffffffd0 =
           lj_meta_lookup((lua_State *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0,(MMS)(in_stack_ffffffffffffffc8 >> 0x20));
      if ((in_stack_ffffffffffffffd0->field_2).it == 0xffffffff) {
        lj_err_optype(in_RDI,in_RSI,(ErrMsg)((ulong)in_RDX >> 0x20));
      }
    }
    if ((in_stack_ffffffffffffffd0->field_2).it == 0xfffffff7) {
      pTVar2 = mmcall(in_RDI,lj_cont_ra,in_stack_ffffffffffffffd0,in_RSI,in_RDX);
      in_RDI->top = pTVar2;
      return (cTValue *)0x0;
    }
    iVar3 = iVar3 + 1;
    in_RSI = in_stack_ffffffffffffffd0;
  } while( true );
}

Assistant:

cTValue *lj_meta_tget(lua_State *L, cTValue *o, cTValue *k)
{
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (!tvisnil(tv) ||
	  !(mo = lj_meta_fast(L, tabref(t->metatable), MM_index)))
	return tv;
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_index))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_ra, mo, o, k);
      return NULL;  /* Trigger metamethod call. */
    }
    o = mo;
  }
  lj_err_msg(L, LJ_ERR_GETLOOP);
  return NULL;  /* unreachable */
}